

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kstring.c
# Opt level: O2

void * kmemmem(void *_str,int n,void *_pat,int m,int **_prep)

{
  byte bVar1;
  ulong uVar2;
  int *__ptr;
  void *__ptr_00;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  size_t __nmemb;
  int iVar15;
  
  if ((_prep == (int **)0x0) || (__ptr = *_prep, __ptr == (int *)0x0)) {
    __ptr = (int *)calloc((long)(m + 0x100),4);
    __nmemb = (size_t)m;
    for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
      __ptr[__nmemb + lVar3] = m;
    }
    uVar6 = (long)m - 1;
    uVar4 = 0;
    uVar5 = 0;
    if (0 < (int)uVar6) {
      uVar5 = uVar6 & 0xffffffff;
    }
    uVar12 = uVar6 & 0xffffffff;
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      __ptr[__nmemb + *(byte *)((long)_pat + uVar4)] = (int)uVar12;
      uVar12 = (ulong)((int)uVar12 - 1);
    }
    __ptr_00 = calloc(__nmemb,4);
    lVar3 = (long)(int)uVar6;
    *(int *)((long)__ptr_00 + lVar3 * 4) = m;
    iVar15 = m + -2;
    iVar9 = 0;
    uVar7 = 0;
    uVar5 = uVar6 & 0xffffffff;
    uVar12 = (ulong)iVar15;
    for (uVar4 = uVar12; uVar11 = (uint)uVar4, -1 < (int)uVar11; uVar4 = uVar4 - 1) {
      iVar13 = (int)uVar5;
      if (((int)uVar11 <= iVar13) ||
         (iVar14 = *(int *)((long)__ptr_00 + (long)(int)(~uVar7 + uVar11 + m) * 4),
         (int)(uVar11 - iVar13) <= iVar14)) {
        uVar2 = (long)iVar13;
        if ((long)uVar4 < (long)iVar13) {
          uVar2 = uVar4;
        }
        do {
          uVar5 = uVar2;
          if ((long)uVar5 < 0) break;
          uVar2 = uVar5 - 1;
        } while (*(char *)((long)_pat + uVar5) ==
                 *(char *)((long)_pat + (long)(iVar9 + (int)uVar5 + 1)));
        iVar14 = iVar15 - (int)uVar5;
        uVar7 = uVar11;
      }
      *(int *)((long)__ptr_00 + (ulong)(uVar11 & 0x7fffffff) * 4) = iVar14;
      iVar15 = iVar15 + -1;
      iVar9 = iVar9 + 1;
    }
    uVar4 = 0;
    uVar5 = 0;
    if (0 < m) {
      uVar5 = (ulong)(uint)m;
    }
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      __ptr[uVar4] = m;
    }
    lVar8 = 0;
    for (lVar10 = lVar3; -1 < lVar10; lVar10 = lVar10 + -1) {
      if (*(int *)((long)__ptr_00 + lVar10 * 4) == (int)lVar10 + 1) {
        for (lVar8 = (long)(int)lVar8; lVar8 < lVar3 - lVar10; lVar8 = lVar8 + 1) {
          if (__ptr[lVar8] == m) {
            __ptr[lVar8] = (int)(lVar3 - lVar10);
          }
        }
      }
    }
    uVar4 = 0xffffffffffffffff;
    if (-1 < (long)uVar12) {
      uVar4 = uVar12;
    }
    uVar5 = uVar6 & 0xffffffff;
    for (lVar3 = 0; uVar4 + 1 != lVar3; lVar3 = lVar3 + 1) {
      __ptr[uVar6 - (long)*(int *)((long)__ptr_00 + lVar3 * 4)] = (int)uVar5;
      uVar5 = (ulong)((int)uVar5 - 1);
    }
    free(__ptr_00);
    if ((_prep != (int **)0x0) && (*_prep == (int *)0x0)) {
      *_prep = __ptr;
    }
  }
  iVar15 = 0;
  do {
    if (n - m < iVar15) {
      if (_prep == (int **)0x0) {
        free(__ptr);
      }
      return (void *)0x0;
    }
    lVar3 = (long)m;
    iVar9 = 1;
    do {
      if (lVar3 < 1) {
        return (void *)((long)_str + (long)iVar15);
      }
      lVar10 = lVar3 + -1;
      bVar1 = *(byte *)((long)_str + lVar3 + (long)iVar15 + -1);
      iVar9 = iVar9 + -1;
      lVar8 = lVar3 + -1;
      lVar3 = lVar10;
    } while (*(byte *)((long)_pat + lVar8) == bVar1);
    iVar13 = iVar9 + __ptr[(long)m + (ulong)bVar1];
    if (iVar9 + __ptr[(long)m + (ulong)bVar1] <= __ptr[lVar10]) {
      iVar13 = __ptr[lVar10];
    }
    iVar15 = iVar15 + iVar13;
  } while( true );
}

Assistant:

void *kmemmem(const void *_str, int n, const void *_pat, int m, int **_prep)
{
	int i, j, *prep = 0, *bmGs, *bmBc;
	const ubyte_t *str, *pat;
	str = (const ubyte_t*)_str; pat = (const ubyte_t*)_pat;
	prep = (_prep == 0 || *_prep == 0)? ksBM_prep(pat, m) : *_prep;
	if (_prep && *_prep == 0) *_prep = prep;
	bmGs = prep; bmBc = prep + m;
	j = 0;
	while (j <= n - m) {
		for (i = m - 1; i >= 0 && pat[i] == str[i+j]; --i);
		if (i >= 0) {
			int max = bmBc[str[i+j]] - m + 1 + i;
			if (max < bmGs[i]) max = bmGs[i];
			j += max;
		} else return (void*)(str + j);
	}
	if (_prep == 0) free(prep);
	return 0;
}